

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O3

string * __thiscall
cmOutputConverter::ConvertToOutputFormat
          (string *__return_storage_ptr__,cmOutputConverter *this,string *source,OutputFormat output
          )

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  cmState *pcVar4;
  char *path;
  size_type sVar5;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (source->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + source->_M_string_length);
  if (output == MAKERULE) {
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              (&local_40,(cmSystemTools *)(__return_storage_ptr__->_M_dataplus)._M_p,path);
  }
  else if ((output & ~MAKERULE) == SHELL) {
    pcVar4 = cmState::Snapshot::GetState(&this->StateSnapshot);
    bVar3 = cmState::UseMSYSShell(pcVar4);
    if ((((bVar3) && (this->LinkScriptShell == false)) &&
        (2 < __return_storage_ptr__->_M_string_length)) &&
       (pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p, pcVar1[1] == ':')) {
      pcVar1[1] = *pcVar1;
      *(__return_storage_ptr__->_M_dataplus)._M_p = '/';
    }
    pcVar4 = cmState::Snapshot::GetState(&this->StateSnapshot);
    bVar3 = cmState::UseWindowsShell(pcVar4);
    if ((bVar3) && (sVar2 = __return_storage_ptr__->_M_string_length, sVar2 != 0)) {
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      sVar5 = 0;
      do {
        if (pcVar1[sVar5] == '/') {
          pcVar1[sVar5] = '\\';
        }
        sVar5 = sVar5 + 1;
      } while (sVar2 != sVar5);
    }
    EscapeForShell(&local_40,this,__return_storage_ptr__,true,false,output == WATCOMQUOTE);
  }
  else {
    if (output != RESPONSE) {
      return __return_storage_ptr__;
    }
    EscapeForShell(&local_40,this,__return_storage_ptr__,false,false,false);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertToOutputFormat(const std::string& source,
                                                     OutputFormat output) const
{
  std::string result = source;
  // Convert it to an output path.
  if (output == MAKERULE)
    {
    result = cmSystemTools::ConvertToOutputPath(result.c_str());
    }
  else if(output == SHELL || output == WATCOMQUOTE)
    {
        // For the MSYS shell convert drive letters to posix paths, so
    // that c:/some/path becomes /c/some/path.  This is needed to
    // avoid problems with the shell path translation.
    if(this->GetState()->UseMSYSShell() && !this->LinkScriptShell)
      {
      if(result.size() > 2 && result[1] == ':')
        {
        result[1] = result[0];
        result[0] = '/';
        }
      }
    if(this->GetState()->UseWindowsShell())
      {
      std::replace(result.begin(), result.end(), '/', '\\');
      }
    result = this->EscapeForShell(result, true, false, output == WATCOMQUOTE);
    }
  else if(output == RESPONSE)
    {
    result = this->EscapeForShell(result, false, false, false);
    }
  return result;
}